

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase982::run(TestCase982 *this)

{
  pointer_____offset_0x10___ puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  WirePointer *pWVar5;
  long lVar6;
  Server *pSVar7;
  ClientHook *pCVar8;
  RequestHook *pRVar9;
  long *plVar10;
  long *plVar11;
  char *pcVar12;
  Disposer *pDVar13;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  Disposer *pDVar14;
  Own<capnp::ClientHook> OVar15;
  int callCount;
  Client client2;
  Client client;
  WaitScope waitScope;
  EventLoop loop;
  int local_224;
  undefined1 local_220 [16];
  long *local_210;
  WirePointer *local_208;
  long local_200;
  Disposer *pDStack_1f8;
  RequestHook *local_1f0;
  undefined1 local_1e8 [16];
  Server *pSStack_1d8;
  undefined1 local_1d0 [8];
  Client local_1c8;
  EventLoop *local_1b8;
  undefined4 local_1b0;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  local_1a8;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> local_170 [3];
  undefined8 *local_140;
  long *local_138;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> local_130 [3];
  undefined8 *local_100;
  long *local_f8;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> local_f0 [3];
  undefined8 *local_c0;
  long *local_b8;
  EventLoop local_b0;
  Maybe<capnp::MessageSize> local_78;
  Maybe<capnp::MessageSize> local_60;
  Maybe<capnp::MessageSize> local_48;
  
  local_224 = 0;
  kj::EventLoop::EventLoop(&local_b0);
  local_1b0 = 0xffffffff;
  local_1b8 = &local_b0;
  kj::EventLoop::enterScope(&local_b0);
  plVar11 = (long *)operator_new(0x20);
  local_220._8_8_ = plVar11 + 2;
  plVar11[3] = 0;
  *plVar11 = (long)&PTR_dispatchCall_0062c920;
  plVar11[2] = (long)&PTR_dispatchCall_0062c958;
  plVar11[1] = (long)&local_224;
  pcVar12 = (char *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestThisCap>::instance;
  local_220._0_8_ = &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestThisCap>::instance;
  OVar15 = Capability::Client::makeLocalClient
                     (&local_1c8,(Own<capnp::Capability::Server> *)local_220);
  uVar3 = local_220._8_8_;
  if ((Server *)local_220._8_8_ != (Server *)0x0) {
    local_220._8_8_ = (Server *)0x0;
    (*(code *)((SegmentReader *)local_220._0_8_)->arena->_vptr_Arena)
              (local_220._0_8_,
               (_func_int *)((long)(_func_int ***)uVar3 + (long)(*(_func_int ***)uVar3)[-2]),
               OVar15.ptr);
  }
  local_1d0 = (undefined1  [8])&Capability::Client::typeinfo;
  local_48.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::barRequest
            (&local_1a8,(Client *)local_1d0,&local_48);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)local_220,(int)&local_1a8,__buf,(size_t)pcVar12,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::wait
            (local_f0,local_220);
  plVar10 = local_b8;
  if (local_b8 != (long *)0x0) {
    local_b8 = (long *)0x0;
    (**(code **)*local_c0)(local_c0,(long)plVar10 + *(long *)(*plVar10 + -0x10));
  }
  pDVar13 = pDStack_1f8;
  lVar6 = local_200;
  if (local_200 != 0) {
    local_200 = 0;
    pDStack_1f8 = (Disposer *)0x0;
    pDVar14 = pDVar13;
    (**local_1f0->_vptr_RequestHook)(local_1f0,lVar6,8,pDVar13,pDVar13,0);
    in_R8D = (int)pDVar14;
    pcVar12 = (char *)pDVar13;
  }
  pWVar5 = local_208;
  if (local_208 != (WirePointer *)0x0) {
    local_208 = (WirePointer *)0x0;
    (**(code **)*local_210)
              (local_210,(long)&(pWVar5->offsetAndKind).value + *(long *)((long)*pWVar5 + -0x10));
  }
  uVar3 = local_220._8_8_;
  if ((Server *)local_220._8_8_ != (Server *)0x0) {
    local_220._8_8_ = (Server *)0x0;
    (*(code *)((SegmentReader *)local_220._0_8_)->arena->_vptr_Arena)
              (local_220._0_8_,
               (_func_int *)((long)(_func_int ***)uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
  }
  pRVar9 = local_1a8.hook.ptr;
  if (local_1a8.hook.ptr != (RequestHook *)0x0) {
    local_1a8.hook.ptr = (RequestHook *)0x0;
    (**(local_1a8.hook.disposer)->_vptr_Disposer)
              (local_1a8.hook.disposer,
               pRVar9->_vptr_RequestHook[-2] + (long)&pRVar9->_vptr_RequestHook);
  }
  if ((local_224 != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_220._0_4_ = 1;
    pcVar12 = "\"failed: expected \" \"(1) == (callCount)\", 1, callCount";
    in_R8D = 0x4cc3e2;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3e0,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",(int *)local_220,&local_224);
  }
  (**(code **)(**(long **)((long)plVar11 + *(long *)(*plVar11 + -0x18) + 8) + 0x20))(local_220);
  uVar4 = local_220._8_8_;
  uVar3 = local_220._0_8_;
  (*(*(_func_int ***)local_220._8_8_)[4])(local_220,local_220._8_8_);
  local_1e8._8_4_ = local_220._0_4_;
  local_1e8._12_4_ = local_220._4_4_;
  pSStack_1d8 = (Server *)local_220._8_8_;
  local_1e8._0_8_ = &Capability::Client::typeinfo;
  (*(code *)((SegmentReader *)uVar3)->arena->_vptr_Arena)
            (uVar3,(_func_int *)((long)(_func_int ***)uVar4 + (long)(*(_func_int ***)uVar4)[-2]));
  if ((local_224 != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_220._0_4_ = 1;
    pcVar12 = "\"failed: expected \" \"(1) == (callCount)\", 1, callCount";
    in_R8D = 0x4cc3e2;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3e3,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",(int *)local_220,&local_224);
  }
  local_60.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::barRequest
            (&local_1a8,(Client *)local_1e8,&local_60);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)local_220,(int)&local_1a8,__buf_00,(size_t)pcVar12,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::wait
            (local_130,local_220);
  plVar11 = local_f8;
  if (local_f8 != (long *)0x0) {
    local_f8 = (long *)0x0;
    (**(code **)*local_100)(local_100,(long)plVar11 + *(long *)(*plVar11 + -0x10));
  }
  pDVar13 = pDStack_1f8;
  lVar6 = local_200;
  if (local_200 != 0) {
    local_200 = 0;
    pDStack_1f8 = (Disposer *)0x0;
    (**local_1f0->_vptr_RequestHook)(local_1f0,lVar6,8,pDVar13,pDVar13,0);
    in_R8D = (int)pDVar13;
  }
  pWVar5 = local_208;
  if (local_208 != (WirePointer *)0x0) {
    local_208 = (WirePointer *)0x0;
    (**(code **)*local_210)
              (local_210,(long)&(pWVar5->offsetAndKind).value + *(long *)((long)*pWVar5 + -0x10));
  }
  uVar3 = local_220._8_8_;
  if ((Server *)local_220._8_8_ != (Server *)0x0) {
    local_220._8_8_ = (Server *)0x0;
    (*(code *)((SegmentReader *)local_220._0_8_)->arena->_vptr_Arena)
              (local_220._0_8_,
               (_func_int *)((long)(_func_int ***)uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
  }
  if (local_1a8.hook.ptr != (RequestHook *)0x0) {
    local_1a8.hook.ptr = (RequestHook *)0x0;
    (**(local_1a8.hook.disposer)->_vptr_Disposer)();
  }
  if ((local_224 != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_220._0_4_ = 2;
    in_R8D = 0x4c9684;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3e5,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",(int *)local_220,&local_224);
  }
  Capability::Client::Client((Client *)(local_220 + 8),(void *)0x0);
  local_220._0_8_ = &Capability::Client::typeinfo;
  puVar1 = *(pointer_____offset_0x10___ *)((long)local_1d0 + -0x18);
  puVar2 = *(undefined8 **)(local_1d0 + (long)puVar1);
  plVar11 = *(long **)(puVar1 + (long)&local_1c8.hook);
  *(undefined8 *)(local_1d0 + (long)puVar1) = local_220._8_8_;
  *(long **)(puVar1 + (long)&local_1c8.hook) = local_210;
  local_210 = (long *)0x0;
  pcVar12 = (char *)local_220._8_8_;
  if (plVar11 != (long *)0x0) {
    (**(code **)*puVar2)(puVar2,(long)plVar11 + *(long *)(*plVar11 + -0x10));
  }
  plVar11 = local_210;
  if (local_210 != (long *)0x0) {
    local_210 = (long *)0x0;
    (***(_func_int ***)local_220._8_8_)(local_220._8_8_,*(long *)(*plVar11 + -0x10) + (long)plVar11)
    ;
  }
  if ((local_224 != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_220._0_4_ = 2;
    pcVar12 = "\"failed: expected \" \"(2) == (callCount)\", 2, callCount";
    in_R8D = 0x4c9684;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3e9,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",(int *)local_220,&local_224);
  }
  local_78.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::barRequest
            (&local_1a8,(Client *)local_1e8,&local_78);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)local_220,(int)&local_1a8,__buf_01,(size_t)pcVar12,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::wait
            (local_170,local_220);
  plVar11 = local_138;
  if (local_138 != (long *)0x0) {
    local_138 = (long *)0x0;
    (**(code **)*local_140)(local_140,(long)plVar11 + *(long *)(*plVar11 + -0x10));
  }
  pDVar13 = pDStack_1f8;
  lVar6 = local_200;
  if (local_200 != 0) {
    local_200 = 0;
    pDStack_1f8 = (Disposer *)0x0;
    (**local_1f0->_vptr_RequestHook)(local_1f0,lVar6,8,pDVar13,pDVar13,0);
  }
  pWVar5 = local_208;
  if (local_208 != (WirePointer *)0x0) {
    local_208 = (WirePointer *)0x0;
    (**(code **)*local_210)
              (local_210,(long)&(pWVar5->offsetAndKind).value + *(long *)((long)*pWVar5 + -0x10));
  }
  uVar3 = local_220._8_8_;
  if ((Server *)local_220._8_8_ != (Server *)0x0) {
    local_220._8_8_ = (Server *)0x0;
    (**(code **)((SegmentReader *)local_220._0_8_)->arena)
              (local_220._0_8_,
               (_func_int *)((long)(_func_int ***)uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
  }
  if (local_1a8.hook.ptr != (RequestHook *)0x0) {
    local_1a8.hook.ptr = (RequestHook *)0x0;
    (**(local_1a8.hook.disposer)->_vptr_Disposer)();
  }
  if ((local_224 != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_220._0_4_ = 3;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3eb,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",(int *)local_220,&local_224);
  }
  Capability::Client::Client((Client *)(local_220 + 8),(void *)0x0);
  local_220._0_8_ = &Capability::Client::typeinfo;
  puVar1 = *(pointer_____offset_0x10___ *)(local_1e8._0_8_ + -0x18);
  puVar2 = *(undefined8 **)(local_1e8 + (long)puVar1);
  plVar11 = *(long **)(puVar1 + (long)(local_1e8 + 8));
  *(undefined8 *)(local_1e8 + (long)puVar1) = local_220._8_8_;
  *(long **)(puVar1 + (long)(local_1e8 + 8)) = local_210;
  local_210 = (long *)0x0;
  if (plVar11 != (long *)0x0) {
    (**(code **)*puVar2)(puVar2,(long)plVar11 + *(long *)(*plVar11 + -0x10));
  }
  plVar11 = local_210;
  if (local_210 != (long *)0x0) {
    local_210 = (long *)0x0;
    (***(_func_int ***)local_220._8_8_)(local_220._8_8_,*(long *)(*plVar11 + -0x10) + (long)plVar11)
    ;
  }
  if ((local_224 != -1) && (kj::_::Debug::minSeverity < 3)) {
    local_220._0_4_ = 0xffffffff;
    kj::_::Debug::log<char_const(&)[37],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3ef,ERROR,"\"failed: expected \" \"(-1) == (callCount)\", -1, callCount",
               (char (*) [37])"failed: expected (-1) == (callCount)",(int *)local_220,&local_224);
  }
  pSVar7 = pSStack_1d8;
  if (pSStack_1d8 != (Server *)0x0) {
    pSStack_1d8 = (Server *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_1e8._12_4_,local_1e8._8_4_))
              ((undefined8 *)CONCAT44(local_1e8._12_4_,local_1e8._8_4_),
               (_func_int *)((long)&pSVar7->_vptr_Server + (long)pSVar7->_vptr_Server[-2]));
  }
  pCVar8 = local_1c8.hook.ptr;
  if (local_1c8.hook.ptr != (ClientHook *)0x0) {
    local_1c8.hook.ptr = (ClientHook *)0x0;
    (**(local_1c8.hook.disposer)->_vptr_Disposer)
              (local_1c8.hook.disposer,
               pCVar8->_vptr_ClientHook[-2] + (long)&pCVar8->_vptr_ClientHook);
  }
  kj::EventLoop::leaveScope(local_1b8);
  kj::EventLoop::~EventLoop(&local_b0);
  return;
}

Assistant:

TEST(Capability, ThisCap) {
  int callCount = 0;
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  auto server = kj::heap<TestThisCap>(callCount);
  TestThisCap* serverPtr = server;

  test::TestInterface::Client client = kj::mv(server);
  client.barRequest().send().wait(waitScope);
  EXPECT_EQ(1, callCount);

  test::TestInterface::Client client2 = serverPtr->getSelf();
  EXPECT_EQ(1, callCount);
  client2.barRequest().send().wait(waitScope);
  EXPECT_EQ(2, callCount);

  client = nullptr;

  EXPECT_EQ(2, callCount);
  client2.barRequest().send().wait(waitScope);
  EXPECT_EQ(3, callCount);

  client2 = nullptr;

  EXPECT_EQ(-1, callCount);
}